

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  int iVar1;
  undefined1 (*rankStats) [16];
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  char cVar11;
  char cVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  int iVar17;
  size_t sVar18;
  byte bVar19;
  HUF_DTable HVar20;
  ulong uVar21;
  uint uVar22;
  U32 current_1;
  uint *puVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  int iVar34;
  size_t sVar35;
  size_t sVar36;
  U32 *rankVal0;
  int iVar38;
  undefined1 auVar37 [16];
  int iVar41;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  U32 nbSymbols;
  U32 tableLog;
  U32 rankVal [13];
  uint local_f0;
  uint local_ec [17];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  sVar35 = 0xffffffffffffffd4;
  sVar36 = sVar35;
  if (0x5db < wkspSize) {
    uVar8 = *DTable;
    uVar25 = uVar8 & 0xff;
    rankStats = (undefined1 (*) [16])((long)workSpace + 0x270);
    *(undefined1 (*) [16])((long)workSpace + 0x2cc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x2c0) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x2b0) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x2a0) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x290) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])((long)workSpace + 0x280) = (undefined1  [16])0x0;
    *rankStats = (undefined1  [16])0x0;
    if ((uVar25 < 0xd) &&
       (sVar18 = HUF_readStats((BYTE *)((long)workSpace + 0x4dc),0x100,(U32 *)rankStats,&local_f0,
                               local_ec,src,srcSize), sVar36 = sVar18, sVar18 < 0xffffffffffffff89))
    {
      cVar12 = (char)uVar8;
      sVar36 = sVar35;
      if (local_ec[0] <= uVar25) {
        iVar1 = local_ec[0] + 1;
        uVar33 = 0;
        uVar16 = local_ec[0];
        do {
          uVar28 = (ulong)uVar16;
          uVar16 = uVar16 - 1;
          uVar33 = uVar33 + 1;
        } while (*(int *)(*rankStats + uVar28 * 4) == 0);
        uVar22 = (local_ec[0] - uVar33) + 2;
        uVar30 = 0;
        if (uVar16 < 0xfffffffe) {
          lVar27 = 0;
          uVar26 = 0;
          do {
            uVar30 = *(int *)((long)workSpace + lVar27 * 4 + 0x274) + uVar26;
            *(uint *)((long)workSpace + lVar27 * 4 + 0x2ac) = uVar26;
            lVar27 = lVar27 + 1;
            uVar26 = uVar30;
          } while ((ulong)uVar22 - 1 != lVar27);
        }
        *(uint *)((long)workSpace + 0x2a8) = uVar30;
        if ((ulong)local_f0 != 0) {
          uVar28 = 0;
          do {
            bVar4 = *(byte *)((long)workSpace + uVar28 + 0x4dc);
            uVar26 = *(uint *)((long)workSpace + (ulong)bVar4 * 4 + 0x2a8);
            *(uint *)((long)workSpace + (ulong)bVar4 * 4 + 0x2a8) = uVar26 + 1;
            *(char *)((long)workSpace + (ulong)uVar26 * 2 + 0x2dc) = (char)uVar28;
            *(byte *)((long)workSpace + (ulong)uVar26 * 2 + 0x2dd) = bVar4;
            uVar28 = uVar28 + 1;
          } while (local_f0 != uVar28);
        }
        uVar26 = (uVar25 - uVar33) + 1;
        *(undefined4 *)((long)workSpace + 0x2a8) = 0;
        if (uVar16 < 0xfffffffe) {
          lVar27 = 0;
          iVar17 = 0;
          do {
            lVar32 = lVar27 * 4;
            cVar11 = (char)lVar27;
            *(int *)((long)workSpace + lVar27 * 4 + 4) = iVar17;
            lVar27 = lVar27 + 1;
            iVar17 = (*(int *)((long)workSpace + lVar32 + 0x274) <<
                     ((cVar12 - (char)local_ec[0]) + cVar11 & 0x1fU)) + iVar17;
          } while ((ulong)uVar22 - 1 != lVar27);
        }
        if (uVar33 < uVar26) {
          uVar28 = (ulong)uVar33;
          lVar27 = uVar28 * 0x34;
          do {
            puVar23 = (uint *)((long)workSpace + 4);
            lVar32 = (ulong)uVar22 - 1;
            if (uVar16 < 0xfffffffe) {
              do {
                *(uint *)((long)puVar23 + lVar27) = *puVar23 >> ((byte)uVar28 & 0x1f);
                lVar32 = lVar32 + -1;
                puVar23 = puVar23 + 1;
              } while (lVar32 != 0);
            }
            uVar28 = uVar28 + 1;
            lVar27 = lVar27 + 0x34;
          } while (uVar26 != (uint)uVar28);
        }
        auVar15 = _DAT_004eac40;
        auVar14 = _DAT_004eac30;
        auVar13 = _DAT_004eac20;
        local_38 = *(undefined4 *)((long)workSpace + 0x30);
        local_48 = *(undefined8 *)((long)workSpace + 0x20);
        uStack_40 = *(undefined8 *)((long)workSpace + 0x28);
        local_58 = *(undefined8 *)((long)workSpace + 0x10);
        uStack_50 = *(undefined8 *)((long)workSpace + 0x18);
        local_68 = *workSpace;
        uStack_60 = *(undefined8 *)((long)workSpace + 8);
        if (uVar30 != 0) {
          uVar28 = 0;
          do {
            bVar4 = *(byte *)((long)workSpace + uVar28 * 2 + 0x2dc);
            bVar5 = *(byte *)((long)workSpace + uVar28 * 2 + 0x2dd);
            uVar22 = iVar1 - (uint)bVar5;
            uVar16 = *(uint *)((long)&local_68 + (ulong)bVar5 * 4);
            uVar29 = (ulong)uVar16;
            bVar19 = (byte)(uVar25 - uVar22);
            iVar17 = 1 << (bVar19 & 0x1f);
            if (uVar25 - uVar22 < uVar33) {
              uVar26 = iVar17 + uVar16;
              if (uVar16 < uVar26) {
                HVar20 = (uVar22 & 0xff) * 0x10000 + (uint)bVar4 + 0x1000000;
                lVar27 = uVar26 - uVar29;
                lVar32 = lVar27 + -1;
                auVar42._8_4_ = (int)lVar32;
                auVar42._0_8_ = lVar32;
                auVar42._12_4_ = (int)((ulong)lVar32 >> 0x20);
                uVar24 = 0;
                do {
                  auVar43._8_4_ = (int)uVar24;
                  auVar43._0_8_ = uVar24;
                  auVar43._12_4_ = (int)(uVar24 >> 0x20);
                  auVar39 = (auVar43 | auVar14) ^ auVar15;
                  iVar34 = SUB164(auVar42 ^ auVar15,0);
                  bVar10 = iVar34 < auVar39._0_4_;
                  iVar38 = SUB164(auVar42 ^ auVar15,4);
                  iVar41 = auVar39._4_4_;
                  if ((bool)(~(iVar38 < iVar41 || iVar41 == iVar38 && bVar10) & 1)) {
                    DTable[uVar29 + uVar24 + 1] = HVar20;
                  }
                  if (iVar38 >= iVar41 && (iVar41 != iVar38 || !bVar10)) {
                    DTable[uVar29 + uVar24 + 2] = HVar20;
                  }
                  auVar39 = (auVar43 | auVar13) ^ auVar15;
                  iVar41 = auVar39._4_4_;
                  if (iVar41 <= iVar38 && (iVar41 != iVar38 || auVar39._0_4_ <= iVar34)) {
                    DTable[uVar29 + uVar24 + 3] = HVar20;
                    DTable[uVar29 + uVar24 + 4] = HVar20;
                  }
                  uVar24 = uVar24 + 4;
                } while ((lVar27 + 3U & 0xfffffffffffffffc) != uVar24);
              }
            }
            else {
              uVar26 = uVar22 + (iVar1 - uVar25);
              uVar24 = 1;
              if (1 < (int)uVar26) {
                uVar24 = (ulong)uVar26;
              }
              uVar9 = *(uint *)((long)workSpace + uVar24 * 4 + 0x2a4);
              lVar27 = (ulong)uVar22 * 0x34;
              local_78 = *(undefined4 *)((long)workSpace + lVar27 + 0x30);
              puVar2 = (undefined8 *)((long)workSpace + lVar27 + 0x10);
              puVar3 = (undefined8 *)((long)workSpace + lVar27 + 0x20);
              local_88 = *puVar3;
              uStack_80 = puVar3[1];
              local_98 = *puVar2;
              uStack_90 = puVar2[1];
              local_a8 = *(undefined8 *)((long)workSpace + lVar27);
              uStack_a0 = ((undefined8 *)((long)workSpace + lVar27))[1];
              if ((1 < (int)uVar26) &&
                 (uVar24 = (ulong)*(uint *)((long)&local_a8 + uVar24 * 4), uVar24 != 0)) {
                iVar34 = (uVar22 & 0xff) * 0x10000 + (uint)bVar4 + 0x1000000;
                lVar27 = uVar24 - 1;
                auVar37._8_4_ = (int)lVar27;
                auVar37._0_8_ = lVar27;
                auVar37._12_4_ = (int)((ulong)lVar27 >> 0x20);
                lVar27 = uVar29 * 4;
                uVar21 = 0;
                auVar39 = auVar14;
                auVar40 = auVar13;
                do {
                  auVar42 = auVar37 ^ auVar15;
                  auVar43 = auVar39 ^ auVar15;
                  iVar38 = auVar42._4_4_;
                  if ((bool)(~(iVar38 < auVar43._4_4_ ||
                              auVar42._0_4_ < auVar43._0_4_ && auVar43._4_4_ == iVar38) & 1)) {
                    *(int *)((long)DTable + uVar21 + lVar27 + 4) = iVar34;
                  }
                  if (auVar43._12_4_ <= auVar42._12_4_ &&
                      (auVar43._8_4_ <= auVar42._8_4_ || auVar43._12_4_ != auVar42._12_4_)) {
                    *(int *)((long)DTable + uVar21 + lVar27 + 8) = iVar34;
                  }
                  iVar41 = SUB164(auVar40 ^ auVar15,4);
                  if (iVar41 <= iVar38 &&
                      (iVar41 != iVar38 || SUB164(auVar40 ^ auVar15,0) <= auVar42._0_4_)) {
                    *(int *)((long)DTable + uVar21 + lVar27 + 0xc) = iVar34;
                    *(int *)((long)DTable + uVar21 + lVar27 + 0x10) = iVar34;
                  }
                  lVar32 = auVar39._8_8_;
                  auVar39._0_8_ = auVar39._0_8_ + 4;
                  auVar39._8_8_ = lVar32 + 4;
                  lVar32 = auVar40._8_8_;
                  auVar40._0_8_ = auVar40._0_8_ + 4;
                  auVar40._8_8_ = lVar32 + 4;
                  uVar21 = uVar21 + 0x10;
                } while ((uVar24 * 4 + 0xc & 0xfffffffffffffff0) != uVar21);
              }
              if (uVar30 != uVar9) {
                uVar24 = 0;
                do {
                  bVar6 = *(byte *)((long)workSpace + uVar24 * 2 + (ulong)uVar9 * 2 + 0x2dc);
                  bVar7 = *(byte *)((long)workSpace + uVar24 * 2 + (ulong)uVar9 * 2 + 0x2dd);
                  uVar26 = *(uint *)((long)&local_a8 + (ulong)bVar7 * 4);
                  uVar31 = (1 << (bVar19 - (char)(iVar1 - (uint)bVar7) & 0x1f)) + uVar26;
                  do {
                    uVar21 = (ulong)uVar26;
                    uVar26 = uVar26 + 1;
                    DTable[uVar29 + uVar21 + 1] =
                         (uint)bVar4 +
                         (((iVar1 - (uint)bVar7) + uVar22 & 0xff) << 0x10 | (uint)bVar6 << 8) +
                         0x2000000;
                  } while (uVar26 < uVar31);
                  *(uint *)((long)&local_a8 + (ulong)bVar7 * 4) = uVar31;
                  uVar24 = uVar24 + 1;
                } while (uVar24 != uVar30 - uVar9);
              }
            }
            *(uint *)((long)&local_68 + (ulong)bVar5 * 4) = iVar17 + uVar16;
            uVar28 = uVar28 + 1;
          } while (uVar28 != uVar30);
        }
        *(char *)DTable = cVar12;
        *(undefined1 *)((long)DTable + 1) = 1;
        *(char *)((long)DTable + 2) = cVar12;
        *(char *)((long)DTable + 3) = (char)(uVar8 >> 0x18);
        sVar36 = sVar18;
      }
    }
  }
  return sVar36;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    rankValCol_t* rankVal;
    U32* rankStats;
    U32* rankStart0;
    sortedSymbol_t* sortedSymbol;
    BYTE* weightList;
    size_t spaceUsed32 = 0;

    rankVal = (rankValCol_t *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += (sizeof(rankValCol_t) * HUF_TABLELOG_MAX) >> 2;
    rankStats = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 1;
    rankStart0 = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 2;
    sortedSymbol = (sortedSymbol_t *)workSpace + (spaceUsed32 * sizeof(U32)) / sizeof(sortedSymbol_t);
    spaceUsed32 += HUF_ALIGN(sizeof(sortedSymbol_t) * (HUF_SYMBOLVALUE_MAX + 1), sizeof(U32)) >> 2;
    weightList = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    rankStart = rankStart0 + 1;
    memset(rankStats, 0, sizeof(U32) * (2 * HUF_TABLELOG_MAX + 2 + 1));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(weightList, HUF_SYMBOLVALUE_MAX + 1, rankStats, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 current = nextRankStart;
            nextRankStart += rankStats[w];
            rankStart[w] = current;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = weightList[s];
            U32 const r = rankStart[w]++;
            sortedSymbol[r].symbol = (BYTE)s;
            sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 current = nextRankVal;
                nextRankVal += rankStats[w] << (w+rescale);
                rankVal0[w] = current;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   sortedSymbol, sizeOfSort,
                   rankStart0, rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}